

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O3

int WebPEncodingSetError(WebPPicture *pic,WebPEncodingError error)

{
  if (pic->error_code == VP8_ENC_OK) {
    pic->error_code = error;
  }
  return 0;
}

Assistant:

int WebPEncodingSetError(const WebPPicture* const pic,
                         WebPEncodingError error) {
  assert((int)error < VP8_ENC_ERROR_LAST);
  assert((int)error >= VP8_ENC_OK);
  // The oldest error reported takes precedence over the new one.
  if (pic->error_code == VP8_ENC_OK) {
    ((WebPPicture*)pic)->error_code = error;
  }
  return 0;
}